

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O0

JSValue js_std_urlGet(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue obj;
  JSValue obj_00;
  long lVar1;
  int iVar2;
  BOOL BVar3;
  char *pcVar4;
  size_t sVar5;
  FILE *__stream;
  int in_ECX;
  JSContext *in_RDI;
  JSValue JVar6;
  BOOL full_flag;
  BOOL binary_flag;
  FILE *f;
  JSValue options_obj;
  JSValue ret_obj;
  JSValue response;
  int status;
  int c;
  size_t len;
  size_t i;
  char *buf;
  DynBuf *header_buf;
  DynBuf header_buf_s;
  DynBuf *data_buf;
  DynBuf data_buf_s;
  DynBuf cmd_buf;
  char *url;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  JSContext *in_stack_fffffffffffffe30;
  JSValueUnion in_stack_fffffffffffffe38;
  JSContext *in_stack_fffffffffffffe40;
  JSContext *in_stack_fffffffffffffe48;
  BOOL *in_stack_fffffffffffffe50;
  JSContext *in_stack_fffffffffffffe58;
  JSValueUnion in_stack_fffffffffffffe60;
  int64_t in_stack_fffffffffffffe68;
  int64_t local_188;
  undefined1 in_stack_fffffffffffffe80 [16];
  undefined4 in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  JSValueUnion local_130;
  int64_t local_128;
  ulong local_110;
  DynBuf *s;
  DynBuf local_c0;
  uint8_t *local_90;
  JSValueUnion local_30;
  int64_t local_28;
  
  s = (DynBuf *)&stack0xffffffffffffff08;
  JVar6.u._4_4_ = in_stack_fffffffffffffe2c;
  JVar6.u.int32 = in_stack_fffffffffffffe28;
  JVar6.tag = (int64_t)in_stack_fffffffffffffe30;
  pcVar4 = JS_ToCString((JSContext *)0x110e48,JVar6);
  lVar1 = local_30;
  if (pcVar4 == (char *)0x0) {
    local_30.ptr = (void *)(lVar1 << 0x20);
    local_28 = 6;
    return _local_30;
  }
  if ((1 < in_ECX) &&
     ((obj.tag = in_stack_fffffffffffffe68, obj.u.ptr = in_stack_fffffffffffffe60.ptr,
      iVar2 = get_bool_option(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,obj,
                              (char *)in_stack_fffffffffffffe48), iVar2 != 0 ||
      (obj_00.tag = in_stack_fffffffffffffe68, obj_00.u.ptr = in_stack_fffffffffffffe60.ptr,
      iVar2 = get_bool_option(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,obj_00,
                              (char *)in_stack_fffffffffffffe48), iVar2 != 0)))) {
    JS_FreeCString(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38.ptr);
    local_30.ptr = (void *)(lVar1 << 0x20);
    local_28 = 6;
    return _local_30;
  }
  js_std_dbuf_init(in_stack_fffffffffffffe30,
                   (DynBuf *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  dbuf_printf((DynBuf *)&local_90,"%s \'\'","curl -s -i");
  sVar5 = strlen(pcVar4);
  for (local_110 = 0; local_110 < sVar5; local_110 = local_110 + 1) {
    if ((pcVar4[local_110] == '\'') || (pcVar4[local_110] == '\\')) {
      dbuf_putc((DynBuf *)in_stack_fffffffffffffe30,
                (uint8_t)((uint)in_stack_fffffffffffffe2c >> 0x18));
    }
    dbuf_putc((DynBuf *)in_stack_fffffffffffffe30,(uint8_t)((uint)in_stack_fffffffffffffe2c >> 0x18)
             );
  }
  JS_FreeCString(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38.ptr);
  dbuf_putstr((DynBuf *)in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38.ptr);
  dbuf_putc((DynBuf *)in_stack_fffffffffffffe30,(uint8_t)((uint)in_stack_fffffffffffffe2c >> 0x18));
  BVar3 = dbuf_error((DynBuf *)&local_90);
  if (BVar3 != 0) {
    dbuf_free((DynBuf *)0x111072);
    local_30.ptr = (void *)(lVar1 << 0x20);
    local_28 = 6;
    return _local_30;
  }
  __stream = popen((char *)local_90,"r");
  dbuf_free((DynBuf *)0x1110b7);
  if (__stream == (FILE *)0x0) {
    JVar6 = JS_ThrowTypeError(in_RDI,"could not start curl");
    return JVar6;
  }
  js_std_dbuf_init(in_stack_fffffffffffffe30,
                   (DynBuf *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  js_std_dbuf_init(in_stack_fffffffffffffe30,
                   (DynBuf *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  pcVar4 = (char *)js_malloc(in_stack_fffffffffffffe48,(size_t)in_stack_fffffffffffffe40);
  if (pcVar4 != (char *)0x0) {
    iVar2 = http_get_header_line
                      ((FILE *)in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
                       (size_t)in_stack_fffffffffffffe38,(DynBuf *)in_stack_fffffffffffffe30);
    if (((iVar2 < 0) ||
        (iVar2 = http_get_status((char *)in_stack_fffffffffffffe38.ptr), iVar2 < 200)) ||
       (299 < iVar2)) {
LAB_001111d3:
      local_130.ptr = (void *)((ulong)in_stack_fffffffffffffe94 << 0x20);
      local_128 = 2;
LAB_0011136f:
      js_free(in_stack_fffffffffffffe30,
              (void *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      pclose(__stream);
      dbuf_free((DynBuf *)0x1113b6);
      dbuf_free((DynBuf *)0x111583);
      local_28 = local_128;
      local_30.ptr = local_130.ptr;
      return _local_30;
    }
    do {
      iVar2 = http_get_header_line
                        ((FILE *)in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,
                         (size_t)in_stack_fffffffffffffe38,(DynBuf *)in_stack_fffffffffffffe30);
      if (iVar2 < 0) goto LAB_001111d3;
      iVar2 = strcmp(pcVar4,"\r\n");
    } while (iVar2 != 0);
    BVar3 = dbuf_error(s);
    if (BVar3 == 0) {
      s->size = s->size - 2;
      while (sVar5 = fread(pcVar4,1,0x1000,__stream), sVar5 != 0) {
        dbuf_put((DynBuf *)in_stack_fffffffffffffe38.ptr,(uint8_t *)in_stack_fffffffffffffe30,
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      }
      BVar3 = dbuf_error(&local_c0);
      if (BVar3 == 0) {
        JVar6 = JS_NewStringLen((JSContext *)
                                CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                                in_stack_fffffffffffffe80._8_8_,in_stack_fffffffffffffe80._0_8_);
        local_130 = JVar6.u;
        local_188 = JVar6.tag;
        local_128 = local_188;
        iVar2 = JS_IsException(JVar6);
        if (iVar2 == 0) goto LAB_0011136f;
      }
    }
  }
  if (__stream != (FILE *)0x0) {
    pclose(__stream);
  }
  js_free(in_stack_fffffffffffffe30,
          (void *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  if (&local_c0 != (DynBuf *)0x0) {
    dbuf_free((DynBuf *)0x1115ed);
  }
  if (s != (DynBuf *)0x0) {
    dbuf_free((DynBuf *)0x111605);
  }
  v.tag = (int64_t)in_stack_fffffffffffffe40;
  v.u.float64 = in_stack_fffffffffffffe38.float64;
  JS_FreeValue(in_stack_fffffffffffffe30,v);
  local_30.ptr = (void *)(lVar1 << 0x20);
  local_28 = 6;
  return _local_30;
}

Assistant:

static JSValue js_std_urlGet(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    const char *url;
    DynBuf cmd_buf;
    DynBuf data_buf_s, *data_buf = &data_buf_s;
    DynBuf header_buf_s, *header_buf = &header_buf_s;
    char *buf; 
    size_t i, len;
    int c, status;
    JSValue response = JS_UNDEFINED, ret_obj;
    JSValueConst options_obj;
    FILE *f;
    BOOL binary_flag, full_flag;
    
    url = JS_ToCString(ctx, argv[0]);
    if (!url)
        return JS_EXCEPTION;
    
    binary_flag = FALSE;
    full_flag = FALSE;
    
    if (argc >= 2) {
        options_obj = argv[1];

        if (get_bool_option(ctx, &binary_flag, options_obj, "binary"))
            goto fail_obj;

        if (get_bool_option(ctx, &full_flag, options_obj, "full")) {
        fail_obj:
            JS_FreeCString(ctx, url);
            return JS_EXCEPTION;
        }
    }
    
    js_std_dbuf_init(ctx, &cmd_buf);
    dbuf_printf(&cmd_buf, "%s ''", URL_GET_PROGRAM);
    len = strlen(url);
    for(i = 0; i < len; i++) {
        c = url[i];
        if (c == '\'' || c == '\\')
            dbuf_putc(&cmd_buf, '\\');
        dbuf_putc(&cmd_buf, c);
    }
    JS_FreeCString(ctx, url);
    dbuf_putstr(&cmd_buf, "''");
    dbuf_putc(&cmd_buf, '\0');
    if (dbuf_error(&cmd_buf)) {
        dbuf_free(&cmd_buf);
        return JS_EXCEPTION;
    }
    //    printf("%s\n", (char *)cmd_buf.buf);
    f = popen((char *)cmd_buf.buf, "r");
    dbuf_free(&cmd_buf);
    if (!f) {
        return JS_ThrowTypeError(ctx, "could not start curl");
    }

    js_std_dbuf_init(ctx, data_buf);
    js_std_dbuf_init(ctx, header_buf);
    
    buf = js_malloc(ctx, URL_GET_BUF_SIZE);
    if (!buf)
        goto fail;

    /* get the HTTP status */
    if (http_get_header_line(f, buf, URL_GET_BUF_SIZE, NULL) < 0) {
        status = 0;
        goto bad_header;
    }
    status = http_get_status(buf);
    if (!full_flag && !(status >= 200 && status <= 299)) {
        goto bad_header;
    }
    
    /* wait until there is an empty line */
    for(;;) {
        if (http_get_header_line(f, buf, URL_GET_BUF_SIZE, header_buf) < 0) {
        bad_header:
            response = JS_NULL;
            goto done;
        }
        if (!strcmp(buf, "\r\n"))
            break;
    }
    if (dbuf_error(header_buf))
        goto fail;
    header_buf->size -= 2; /* remove the trailing CRLF */

    /* download the data */
    for(;;) {
        len = fread(buf, 1, URL_GET_BUF_SIZE, f);
        if (len == 0)
            break;
        dbuf_put(data_buf, (uint8_t *)buf, len);
    }
    if (dbuf_error(data_buf))
        goto fail;
    if (binary_flag) {
        response = JS_NewArrayBufferCopy(ctx,
                                         data_buf->buf, data_buf->size);
    } else {
        response = JS_NewStringLen(ctx, (char *)data_buf->buf, data_buf->size);
    }
    if (JS_IsException(response))
        goto fail;
 done:
    js_free(ctx, buf);
    buf = NULL;
    pclose(f);
    f = NULL;
    dbuf_free(data_buf);
    data_buf = NULL;

    if (full_flag) {
        ret_obj = JS_NewObject(ctx);
        if (JS_IsException(ret_obj))
            goto fail;
        JS_DefinePropertyValueStr(ctx, ret_obj, "response",
                                  response,
                                  JS_PROP_C_W_E);
        if (!JS_IsNull(response)) {
            JS_DefinePropertyValueStr(ctx, ret_obj, "responseHeaders",
                                      JS_NewStringLen(ctx, (char *)header_buf->buf,
                                                      header_buf->size),
                                      JS_PROP_C_W_E);
            JS_DefinePropertyValueStr(ctx, ret_obj, "status",
                                      JS_NewInt32(ctx, status),
                                      JS_PROP_C_W_E);
        }
    } else {
        ret_obj = response;
    }
    dbuf_free(header_buf);
    return ret_obj;
 fail:
    if (f)
        pclose(f);
    js_free(ctx, buf);
    if (data_buf)
        dbuf_free(data_buf);
    if (header_buf)
        dbuf_free(header_buf);
    JS_FreeValue(ctx, response);
    return JS_EXCEPTION;
}